

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cpp
# Opt level: O3

void __thiscall
spvtools::opt::Module::ToBinary
          (Module *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *binary,bool skip_nop)

{
  uint32_t *puVar1;
  uint *puVar2;
  undefined7 in_register_00000011;
  iterator iVar3;
  pointer puVar4;
  bool between_label_and_phi_var;
  bool between_merge_and_branch;
  Instruction *last_line_inst;
  DebugScope last_scope;
  undefined1 local_76;
  undefined1 local_75;
  undefined4 local_74;
  pointer local_70;
  uint32_t *local_68;
  undefined8 local_60;
  undefined8 local_58;
  _Any_data local_50;
  code *local_40;
  code *local_38;
  
  local_74 = (undefined4)CONCAT71(in_register_00000011,skip_nop);
  iVar3._M_current =
       (binary->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  puVar2 = (binary->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  if (iVar3._M_current == puVar2) {
    std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,std::allocator<unsigned_int>> *)binary,iVar3,(uint *)this);
    iVar3._M_current =
         (binary->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    puVar2 = (binary->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar3._M_current = (this->header_).magic_number;
    iVar3._M_current = iVar3._M_current + 1;
    (binary->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar3._M_current;
  }
  puVar1 = &(this->header_).version;
  if (iVar3._M_current == puVar2) {
    std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,std::allocator<unsigned_int>> *)binary,iVar3,puVar1);
    iVar3._M_current =
         (binary->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    puVar2 = (binary->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar3._M_current = *puVar1;
    iVar3._M_current = iVar3._M_current + 1;
    (binary->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar3._M_current;
  }
  puVar1 = &(this->header_).generator;
  if (iVar3._M_current == puVar2) {
    std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,std::allocator<unsigned_int>> *)binary,iVar3,puVar1);
    iVar3._M_current =
         (binary->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    puVar2 = (binary->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar3._M_current = *puVar1;
    iVar3._M_current = iVar3._M_current + 1;
    (binary->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar3._M_current;
  }
  local_68 = &(this->header_).bound;
  if (iVar3._M_current == puVar2) {
    std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,std::allocator<unsigned_int>> *)binary,iVar3,local_68);
    iVar3._M_current =
         (binary->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    puVar2 = (binary->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar3._M_current = *local_68;
    iVar3._M_current = iVar3._M_current + 1;
    (binary->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar3._M_current;
  }
  puVar1 = &(this->header_).schema;
  if (iVar3._M_current == puVar2) {
    std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,std::allocator<unsigned_int>> *)binary,iVar3,puVar1);
    puVar4 = (binary->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
  }
  else {
    *iVar3._M_current = *puVar1;
    puVar4 = iVar3._M_current + 1;
    (binary->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = puVar4;
  }
  local_70 = (binary->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
  local_58 = 0;
  local_60 = 0;
  local_75 = 0;
  local_76 = 0;
  local_50._8_8_ = 0;
  local_50._M_unused._M_object = operator_new(0x38);
  *(vector<unsigned_int,_std::allocator<unsigned_int>_> **)local_50._M_unused._0_8_ = binary;
  *(code *)((long)local_50._M_unused._0_8_ + 8) = SUB41(local_74,0);
  *(undefined8 **)((long)local_50._M_unused._0_8_ + 0x10) = &local_58;
  *(undefined8 **)((long)local_50._M_unused._0_8_ + 0x18) = &local_60;
  *(undefined1 **)((long)local_50._M_unused._0_8_ + 0x20) = &local_75;
  *(undefined1 **)((long)local_50._M_unused._0_8_ + 0x28) = &local_76;
  *(Module **)((long)local_50._M_unused._0_8_ + 0x30) = this;
  local_38 = std::
             _Function_handler<void_(const_spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/module.cpp:154:21)>
             ::_M_invoke;
  local_40 = std::
             _Function_handler<void_(const_spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/module.cpp:154:21)>
             ::_M_manager;
  ForEachInst(this,(function<void_(const_spvtools::opt::Instruction_*)> *)&local_50,true);
  if (local_40 != (code *)0x0) {
    (*local_40)(&local_50,&local_50,__destroy_functor);
  }
  *(uint32_t *)
   ((long)puVar4 +
   (long)(binary->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
         super__Vector_impl_data._M_start + (-8 - (long)local_70)) = *local_68;
  return;
}

Assistant:

void Module::ToBinary(std::vector<uint32_t>* binary, bool skip_nop) const {
  binary->push_back(header_.magic_number);
  binary->push_back(header_.version);
  // TODO(antiagainst): should we change the generator number?
  binary->push_back(header_.generator);
  binary->push_back(header_.bound);
  binary->push_back(header_.schema);

  size_t bound_idx = binary->size() - 2;
  DebugScope last_scope(kNoDebugScope, kNoInlinedAt);
  const Instruction* last_line_inst = nullptr;
  bool between_merge_and_branch = false;
  bool between_label_and_phi_var = false;
  auto write_inst = [binary, skip_nop, &last_scope, &last_line_inst,
                     &between_merge_and_branch, &between_label_and_phi_var,
                     this](const Instruction* i) {
    // Skip emitting line instructions between merge and branch instructions.
    auto opcode = i->opcode();
    if (between_merge_and_branch && i->IsLineInst()) {
      return;
    }
    if (last_line_inst != nullptr) {
      // If the current instruction is OpLine or DebugLine and it is the same
      // as the last line instruction that is still effective (can be applied
      // to the next instruction), we skip writing the current instruction.
      if (i->IsLine()) {
        uint32_t operand_index = 0;
        if (last_line_inst->WhileEachInOperand(
                [&operand_index, i](const uint32_t* word) {
                  assert(i->NumInOperandWords() > operand_index);
                  return *word == i->GetSingleWordInOperand(operand_index++);
                })) {
          return;
        }
      } else if (!i->IsNoLine() && i->dbg_line_insts().empty()) {
        // If the current instruction does not have the line information,
        // the last line information is not effective any more. Emit OpNoLine
        // or DebugNoLine to specify it.
        uint32_t shader_set_id = context()
                                     ->get_feature_mgr()
                                     ->GetExtInstImportId_Shader100DebugInfo();
        if (shader_set_id != 0) {
          binary->push_back((5 << 16) |
                            static_cast<uint16_t>(spv::Op::OpExtInst));
          binary->push_back(context()->get_type_mgr()->GetVoidTypeId());
          binary->push_back(context()->TakeNextId());
          binary->push_back(shader_set_id);
          binary->push_back(NonSemanticShaderDebugInfo100DebugNoLine);
        } else {
          binary->push_back((1 << 16) |
                            static_cast<uint16_t>(spv::Op::OpNoLine));
        }
        last_line_inst = nullptr;
      }
    }

    if (opcode == spv::Op::OpLabel) {
      between_label_and_phi_var = true;
    } else if (opcode != spv::Op::OpVariable && opcode != spv::Op::OpPhi &&
               !spvtools::opt::IsOpLineInst(opcode)) {
      between_label_and_phi_var = false;
    }

    if (!(skip_nop && i->IsNop())) {
      const auto& scope = i->GetDebugScope();
      if (scope != last_scope && !between_merge_and_branch) {
        // Can only emit nonsemantic instructions after all phi instructions
        // in a block so don't emit scope instructions before phi instructions
        // for NonSemantic.Shader.DebugInfo.100.
        if (!between_label_and_phi_var ||
            context()
                ->get_feature_mgr()
                ->GetExtInstImportId_OpenCL100DebugInfo()) {
          // Emit DebugScope |scope| to |binary|.
          auto dbg_inst = ext_inst_debuginfo_.begin();
          scope.ToBinary(dbg_inst->type_id(), context()->TakeNextId(),
                         dbg_inst->GetSingleWordOperand(2), binary);
        }
        last_scope = scope;
      }

      i->ToBinaryWithoutAttachedDebugInsts(binary);
    }
    // Update the last line instruction.
    between_merge_and_branch = false;
    if (spvOpcodeIsBlockTerminator(opcode) || i->IsNoLine()) {
      last_line_inst = nullptr;
    } else if (opcode == spv::Op::OpLoopMerge ||
               opcode == spv::Op::OpSelectionMerge) {
      between_merge_and_branch = true;
      last_line_inst = nullptr;
    } else if (i->IsLine()) {
      last_line_inst = i;
    }
  };
  ForEachInst(write_inst, true);

  // We create new instructions for DebugScope and DebugNoLine. The bound must
  // be updated.
  binary->data()[bound_idx] = header_.bound;
}